

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

Layer * ncnn::ConvolutionDepthWise_layer_creator(void)

{
  Layer *this;
  
  this = (Layer *)operator_new(0x278);
  Layer::Layer(this);
  this->_vptr_Layer = (_func_int **)&PTR__ConvolutionDepthWise_00176248;
  this[1].name._M_string_length = 0;
  this[1].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[1].name.field_2 + 4) = 0;
  *(undefined8 *)((long)&this[1].name.field_2 + 0xc) = 0;
  this[3].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[3].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[3].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this[3].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[2]._vptr_Layer = (_func_int **)0x0;
  *(undefined8 *)((long)&this[2]._vptr_Layer + 4) = 0;
  *(undefined8 *)&this[2].typeindex = 0;
  this[2].type._M_string_length = 0;
  this[2].type.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[2].type.field_2 + 8) = 0;
  this[2].name._M_dataplus._M_p = (pointer)0x0;
  this[2].name._M_string_length = 0;
  this[2].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[2].name.field_2 + 4) = 0;
  *(undefined8 *)((long)&this[2].name.field_2 + 0xc) = 0;
  this[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[3]._vptr_Layer = (_func_int **)0x0;
  *(undefined8 *)((long)&this[3]._vptr_Layer + 4) = 0;
  *(undefined8 *)&this[3].typeindex = 0;
  *(undefined8 *)((long)&this[3].name.field_2 + 4) = 0;
  *(undefined8 *)((long)&this[3].name.field_2 + 0xc) = 0;
  this[3].name._M_string_length = 0;
  this[3].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[3].type.field_2 + 8) = 0;
  this[3].name._M_dataplus._M_p = (pointer)0x0;
  this[3].type._M_string_length = 0;
  this[3].type.field_2._M_allocated_capacity = 0;
  this[4].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this[4].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this[4].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  this[4].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this[4].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[4].name.field_2 + 8) = 0;
  this[4].name._M_dataplus._M_p = (pointer)0x0;
  this[4].name._M_string_length = 0;
  this[4].type.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this[4].type.field_2 + 8) = 0;
  this[4].type._M_dataplus._M_p = (pointer)0x0;
  this[4].type._M_string_length = 0;
  this[4]._vptr_Layer = (_func_int **)0x0;
  this[4].one_blob_only = false;
  this[4].support_inplace = false;
  this[4].support_vulkan = false;
  this[4].field_0xb = 0;
  this[4].typeindex = 0;
  this[4].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->one_blob_only = true;
  this->support_inplace = false;
  *(undefined1 *)
   ((long)&this[3].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 5) = 0;
  return this;
}

Assistant:

ConvolutionDepthWise::ConvolutionDepthWise()
{
    one_blob_only = true;
    support_inplace = false;

    use_int8_requantize = false;
}